

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O2

void __thiscall
FIX::HttpConnection::showRow
          (HttpConnection *this,stringstream *s,string *name,int value,string *url)

{
  ostream *poVar1;
  TAG *pTVar2;
  ostream *stream;
  stringstream href;
  A a;
  TD td;
  CENTER center;
  TR tr;
  allocator<char> local_8d9;
  string local_8d8;
  string local_8b8;
  stringstream local_898 [16];
  ostream local_888 [376];
  TAG local_710;
  TAG local_558;
  TAG local_3a0;
  TAG local_1e8;
  
  stream = (ostream *)(s + 0x10);
  HTML::TR::TR((TR *)&local_1e8,stream);
  HTML::TAG::text(&local_1e8);
  HTML::TD::TD((TD *)&local_558,stream);
  HTML::TAG::text(&local_558,name);
  HTML::TAG::~TAG(&local_558);
  HTML::TD::TD((TD *)&local_558,stream);
  HTML::TAG::text(&local_558,value);
  HTML::TAG::~TAG(&local_558);
  HTML::TD::TD((TD *)&local_558,stream);
  HTML::TAG::text(&local_558);
  HTML::CENTER::CENTER((CENTER *)&local_3a0,stream);
  HTML::TAG::text(&local_3a0);
  std::__cxx11::stringstream::stringstream(local_898);
  poVar1 = std::operator<<(local_888,(string *)url);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<((ostream *)poVar1,value + -10);
  HTML::A::A((A *)&local_710,stream);
  std::__cxx11::stringbuf::str();
  pTVar2 = &HTML::A::href((A *)&local_710,&local_8b8)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"<<",&local_8d9);
  HTML::TAG::text(pTVar2,&local_8d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8b8);
  HTML::TAG::~TAG(&local_710);
  std::__cxx11::stringstream::~stringstream(local_898);
  std::operator<<(stream,HTML::NBSP);
  std::__cxx11::stringstream::stringstream(local_898);
  poVar1 = std::operator<<(local_888,(string *)url);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<((ostream *)poVar1,value + -1);
  HTML::A::A((A *)&local_710,stream);
  std::__cxx11::stringbuf::str();
  pTVar2 = &HTML::A::href((A *)&local_710,&local_8b8)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"<",&local_8d9);
  HTML::TAG::text(pTVar2,&local_8d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8b8);
  HTML::TAG::~TAG(&local_710);
  std::__cxx11::stringstream::~stringstream(local_898);
  poVar1 = std::operator<<(stream,HTML::NBSP);
  poVar1 = std::operator<<(poVar1,"|");
  std::operator<<(poVar1,HTML::NBSP);
  std::__cxx11::stringstream::stringstream(local_898);
  poVar1 = std::operator<<(local_888,(string *)url);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<((ostream *)poVar1,value + 1);
  HTML::A::A((A *)&local_710,stream);
  std::__cxx11::stringbuf::str();
  pTVar2 = &HTML::A::href((A *)&local_710,&local_8b8)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,">",&local_8d9);
  HTML::TAG::text(pTVar2,&local_8d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8b8);
  HTML::TAG::~TAG(&local_710);
  std::__cxx11::stringstream::~stringstream(local_898);
  std::operator<<(stream,HTML::NBSP);
  std::__cxx11::stringstream::stringstream(local_898);
  poVar1 = std::operator<<(local_888,(string *)url);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<((ostream *)poVar1,value + 10);
  HTML::A::A((A *)&local_710,stream);
  std::__cxx11::stringbuf::str();
  pTVar2 = &HTML::A::href((A *)&local_710,&local_8b8)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,">>",&local_8d9);
  HTML::TAG::text(pTVar2,&local_8d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8b8);
  HTML::TAG::~TAG(&local_710);
  std::__cxx11::stringstream::~stringstream(local_898);
  HTML::TAG::~TAG(&local_3a0);
  HTML::TAG::~TAG(&local_558);
  HTML::TAG::~TAG(&local_1e8);
  return;
}

Assistant:

void HttpConnection::showRow
( std::stringstream& s, const std::string& name, int value, const std::string& url )
{
    { TR tr(s); tr.text();
      { TD td(s); td.text(name); }
      { TD td(s); td.text(value); }
      { TD td(s); td.text();
        CENTER center(s); center.text();
        {
          std::stringstream href;
          href << url << "&" << name << "=" << value - 10;
          A a(s); a.href(href.str()).text("<<");
        }
        s << NBSP;
        {
          std::stringstream href;
          href << url << "&" << name << "=" << value - 1;
          A a(s); a.href(href.str()).text("<");
        }
        s << NBSP << "|" << NBSP;
        {
          std::stringstream href;
          href << url << "&" << name << "=" << value + 1;
          A a(s); a.href(href.str()).text(">");
        }
        s << NBSP;
        {
          std::stringstream href;
          href << url << "&" << name << "=" << value + 10;
          A a(s); a.href(href.str()).text(">>");
        }
      }
    }
}